

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ManCheckSuppOverlap(Gia_Man_t *p,int iNode1,int iNode2)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  if (iNode2 == 0 || iNode1 == 0) {
    return 0;
  }
  pGVar2 = Gia_ManObj(p,iNode1);
  Gia_ManCheckSuppMark_rec(p,pGVar2);
  pGVar2 = Gia_ManObj(p,iNode2);
  iVar1 = Gia_ManCheckSupp_rec(p,pGVar2);
  pGVar2 = Gia_ManObj(p,iNode1);
  Gia_ManCheckSuppUnmark_rec(p,pGVar2);
  return iVar1;
}

Assistant:

int Gia_ManCheckSuppOverlap( Gia_Man_t * p, int iNode1, int iNode2 )
{
    int Result;
    if ( iNode1 == 0 || iNode2 == 0 )
        return 0;
    Gia_ManCheckSuppMark_rec( p, Gia_ManObj(p, iNode1) );
    Result = Gia_ManCheckSupp_rec( p, Gia_ManObj(p, iNode2) );
    Gia_ManCheckSuppUnmark_rec( p, Gia_ManObj(p, iNode1) );
    return Result;
}